

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkAigToLogicSop(Abc_Ntk_t *pNtk)

{
  Mem_Flex_t *pMVar1;
  bool bVar2;
  int iVar3;
  int fCompl1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *p;
  int *pfCompl;
  char *pcVar6;
  Abc_Ntk_t *pAVar7;
  int local_40;
  int fChoices;
  int k;
  int i;
  Vec_Int_t *vInts;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  bVar2 = false;
  iVar3 = Abc_NtkIsStrash(pNtk);
  if (iVar3 != 0) {
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
    pAVar4 = Abc_AigConst1(pNtk);
    iVar3 = Abc_ObjFanoutNum(pAVar4);
    if (0 < iVar3) {
      pAVar5 = Abc_NtkCreateNodeConst1(pNtk_00);
      (pAVar4->field_6).pCopy = pAVar5;
    }
    for (fChoices = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), fChoices < iVar3; fChoices = fChoices + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,fChoices);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar4), iVar3 != 0)) {
        Abc_NtkDupObj(pNtk_00,pAVar4,0);
        pMVar1 = (Mem_Flex_t *)pNtk_00->pManFunc;
        iVar3 = Abc_ObjFaninC0(pAVar4);
        fCompl1 = Abc_ObjFaninC1(pAVar4);
        pcVar6 = Abc_SopCreateAnd2(pMVar1,iVar3,fCompl1);
        (((pAVar4->field_6).pCopy)->field_5).pData = pcVar6;
      }
    }
    for (fChoices = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), fChoices < iVar3; fChoices = fChoices + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,fChoices);
      if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar4), iVar3 != 0)) &&
         (iVar3 = Abc_AigNodeIsChoice(pAVar4), iVar3 != 0)) {
        pAVar5 = Abc_NtkCreateNode(pNtk_00);
        p = Vec_IntAlloc(10);
        for (pNodeNew = pAVar4; pNodeNew != (Abc_Obj_t *)0x0;
            pNodeNew = (Abc_Obj_t *)(pNodeNew->field_5).pData) {
          Vec_IntPush(p,(uint)((*(uint *)&pAVar4->field_0x14 >> 7 & 1) !=
                              (*(uint *)&pNodeNew->field_0x14 >> 7 & 1)));
          Abc_ObjAddFanin(pAVar5,(pNodeNew->field_6).pCopy);
        }
        pMVar1 = (Mem_Flex_t *)pNtk_00->pManFunc;
        iVar3 = Vec_IntSize(p);
        pfCompl = Vec_IntArray(p);
        pcVar6 = Abc_SopCreateOrMultiCube(pMVar1,iVar3,pfCompl);
        (pAVar5->field_5).pData = pcVar6;
        *(Abc_Obj_t **)((long)(pAVar4->field_6).pTemp + 0x40) = pAVar5;
        Vec_IntFree(p);
        bVar2 = true;
      }
    }
    for (fChoices = 0; iVar3 = Vec_PtrSize(pNtk->vObjs), fChoices < iVar3; fChoices = fChoices + 1)
    {
      pAVar4 = Abc_NtkObj(pNtk,fChoices);
      if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar3 = Abc_ObjIsNode(pAVar4), iVar3 != 0)) {
        for (local_40 = 0; iVar3 = Abc_ObjFaninNum(pAVar4), local_40 < iVar3;
            local_40 = local_40 + 1) {
          pAVar5 = Abc_ObjFanin(pAVar4,local_40);
          if ((((pAVar5->field_6).pCopy)->field_6).pTemp == (void *)0x0) {
            Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar5->field_6).pCopy);
          }
          else {
            Abc_ObjAddFanin((pAVar4->field_6).pCopy,(((pAVar5->field_6).pCopy)->field_6).pCopy);
          }
        }
      }
    }
    for (fChoices = 0; iVar3 = Abc_NtkCoNum(pNtk), fChoices < iVar3; fChoices = fChoices + 1) {
      pAVar4 = Abc_NtkCo(pNtk,fChoices);
      pAVar5 = Abc_ObjFanin0(pAVar4);
      if ((((pAVar5->field_6).pCopy)->field_6).pTemp == (void *)0x0) {
        pAVar5 = (pAVar5->field_6).pCopy;
        iVar3 = Abc_ObjFaninC0(pAVar4);
        vInts = (Vec_Int_t *)Abc_ObjNotCond(pAVar5,iVar3);
      }
      else {
        pAVar5 = (((pAVar5->field_6).pCopy)->field_6).pCopy;
        iVar3 = Abc_ObjFaninC0(pAVar4);
        vInts = (Vec_Int_t *)Abc_ObjNotCond(pAVar5,iVar3);
      }
      Abc_ObjAddFanin((pAVar4->field_6).pCopy,(Abc_Obj_t *)vInts);
    }
    if (bVar2) {
      Abc_NtkLogicMakeSimpleCos2(pNtk_00,0);
    }
    else {
      Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      iVar3 = Abc_NtkIsStrash(pNtk->pExdc);
      if (iVar3 == 0) {
        pAVar7 = Abc_NtkDup(pNtk->pExdc);
        pNtk_00->pExdc = pAVar7;
      }
      else {
        pAVar7 = Abc_NtkAigToLogicSop(pNtk->pExdc);
        pNtk_00->pExdc = pAVar7;
      }
    }
    iVar3 = Abc_NtkCheck(pNtk_00);
    if (iVar3 == 0) {
      fprintf(_stdout,"Abc_NtkAigToLogicSop(): Network check has failed.\n");
    }
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcNetlist.c"
                ,0x104,"Abc_Ntk_t *Abc_NtkAigToLogicSop(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSop( Abc_Ntk_t * pNtk )
{
    extern int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate );

    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeNew;
    Vec_Int_t * vInts;
    int i, k, fChoices = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // if the constant node is used, duplicate it
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    // duplicate the nodes and create node functions
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        pObj->pCopy->pData = Abc_SopCreateAnd2( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    }
    // create the choice nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;
        // create an OR gate
        pNodeNew = Abc_NtkCreateNode(pNtkNew);
        // add fanins
        vInts = Vec_IntAlloc( 10 );
        for ( pFanin = pObj; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            Vec_IntPush( vInts, (int)(pObj->fPhase != pFanin->fPhase) );
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // create the logic function
        pNodeNew->pData = Abc_SopCreateOrMultiCube( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_IntSize(vInts), Vec_IntArray(vInts) );
        // set the new node
        pObj->pCopy->pCopy = pNodeNew;
        Vec_IntFree( vInts );
        fChoices = 1;
    }
    // connect the internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->pCopy->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // connect the COs
//    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin->pCopy->pCopy )
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy->pCopy, Abc_ObjFaninC0(pObj));
        else
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }

    // fix the problem with complemented and duplicated CO edges
    if ( fChoices )
        Abc_NtkLogicMakeSimpleCos2( pNtkNew, 0 );
    else
        Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
    {
        if ( Abc_NtkIsStrash(pNtk->pExdc) )
            pNtkNew->pExdc = Abc_NtkAigToLogicSop( pNtk->pExdc );
        else
            pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAigToLogicSop(): Network check has failed.\n" );
    return pNtkNew;
}